

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolslib.cpp
# Opt level: O1

int tools_add(lua_State *l)

{
  int iVar1;
  int arg;
  bool bVar2;
  lua_Number n;
  lua_Number lVar3;
  
  iVar1 = lua_gettop(l);
  if (iVar1 < 1) {
    n = 0.0;
  }
  else {
    n = 0.0;
    arg = 1;
    do {
      lVar3 = luaL_checknumber(l,arg);
      n = n + lVar3;
      bVar2 = arg != iVar1;
      arg = arg + 1;
    } while (bVar2);
  }
  lua_pushnumber(l,n);
  return 1;
}

Assistant:

static int tools_add(lua_State *l) {
    int paramNum = lua_gettop(l);
    double sum = 0;
    for (int i = 1; i <= paramNum; i++) {
        double value = luaL_checknumber(l, i);
        sum += value;
    }
    lua_pushnumber(l, sum);

    return 1;
}